

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void update_history(char *flname)

{
  int iVar1;
  char *pcVar2;
  Name local_840 [3];
  Name local_828;
  int local_81c;
  char local_818 [4];
  int max_files;
  char absolute [2048];
  int i;
  char *flname_local;
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&local_81c,5);
  if (10 < local_81c) {
    local_81c = 10;
  }
  fl_filename_absolute(local_818,0x800,flname);
  absolute[0x7fc] = '\0';
  absolute[0x7fd] = '\0';
  absolute[0x7fe] = '\0';
  absolute[0x7ff] = '\0';
  while (((int)absolute._2044_4_ < local_81c &&
         (iVar1 = strcmp(local_818,absolute_history[(int)absolute._2044_4_]), iVar1 != 0))) {
    absolute._2044_4_ = absolute._2044_4_ + 1;
  }
  if (absolute._2044_4_ != 0) {
    if (local_81c <= (int)absolute._2044_4_) {
      absolute._2044_4_ = local_81c + -1;
    }
    memmove(absolute_history + 1,absolute_history,(long)(int)absolute._2044_4_ << 0xb);
    memmove(relative_history + 1,relative_history,(long)(int)absolute._2044_4_ << 0xb);
    fl_strlcpy(absolute_history[0],local_818,0x800);
    fl_filename_relative(relative_history[0],0x800,absolute_history[0]);
    absolute[0x7fc] = '\0';
    absolute[0x7fd] = '\0';
    absolute[0x7fe] = '\0';
    absolute[0x7ff] = '\0';
    for (; (int)absolute._2044_4_ < local_81c; absolute._2044_4_ = absolute._2044_4_ + 1) {
      Fl_Preferences::Name::Name(&local_828,"file%d",(ulong)(uint)absolute._2044_4_);
      pcVar2 = Fl_Preferences::Name::operator_cast_to_char_(&local_828);
      Fl_Preferences::set(&fluid_prefs,pcVar2,absolute_history[(int)absolute._2044_4_]);
      Fl_Preferences::Name::~Name(&local_828);
      if (absolute_history[(int)absolute._2044_4_][0] == '\0') break;
      if (absolute._2044_4_ == 9) {
        history_item[9].flags = 0x80;
      }
      else {
        history_item[(int)absolute._2044_4_].flags = 0;
      }
    }
    for (; (int)absolute._2044_4_ < 10; absolute._2044_4_ = absolute._2044_4_ + 1) {
      Fl_Preferences::Name::Name(local_840,"file%d",(ulong)(uint)absolute._2044_4_);
      pcVar2 = Fl_Preferences::Name::operator_cast_to_char_(local_840);
      Fl_Preferences::set(&fluid_prefs,pcVar2,"");
      Fl_Preferences::Name::~Name(local_840);
      if (absolute._2044_4_ != 0) {
        history_item[absolute._2044_4_ + -1].flags =
             history_item[absolute._2044_4_ + -1].flags | 0x80;
      }
      Fl_Menu_Item::hide(history_item + (int)absolute._2044_4_);
    }
    Fl_Preferences::flush(&fluid_prefs);
  }
  return;
}

Assistant:

void update_history(const char *flname) {
  int	i;		// Looping var
  char	absolute[FL_PATH_MAX];
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  fl_filename_absolute(absolute, sizeof(absolute), flname);

  for (i = 0; i < max_files; i ++)
#if defined(WIN32) || defined(__APPLE__)
    if (!strcasecmp(absolute, absolute_history[i])) break;
#else
    if (!strcmp(absolute, absolute_history[i])) break;
#endif // WIN32 || __APPLE__

  if (i == 0) return;

  if (i >= max_files) i = max_files - 1;

  // Move the other flnames down in the list...
  memmove(absolute_history + 1, absolute_history,
          i * sizeof(absolute_history[0]));
  memmove(relative_history + 1, relative_history,
          i * sizeof(relative_history[0]));

  // Put the new file at the top...
  strlcpy(absolute_history[0], absolute, sizeof(absolute_history[0]));

  fl_filename_relative(relative_history[0], sizeof(relative_history[0]),
                       absolute_history[0]);

  // Update the menu items as needed...
  for (i = 0; i < max_files; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), absolute_history[i]);
    if (absolute_history[i][0]) {
      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), "");
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
  fluid_prefs.flush();
}